

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.cpp
# Opt level: O0

void __thiscall
pstd::pmr::NewDeleteResource::do_deallocate
          (NewDeleteResource *this,void *ptr,size_t bytes,size_t alignment)

{
  void *in_RSI;
  
  if (in_RSI != (void *)0x0) {
    free(in_RSI);
  }
  return;
}

Assistant:

void do_deallocate(void *ptr, size_t bytes, size_t alignment) {
        if (!ptr)
            return;
#if defined(PBRT_HAVE__ALIGNED_MALLOC)
        _aligned_free(ptr);
#else
        free(ptr);
#endif
    }